

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

bool __thiscall
QSocks5SocketEngine::initialize
          (QSocks5SocketEngine *this,SocketType type,NetworkLayerProtocol protocol)

{
  long lVar1;
  int iVar2;
  
  lVar1 = *(long *)(this + 8);
  LOCK();
  UNLOCK();
  iVar2 = nextDescriptor()::counter + 1;
  nextDescriptor()::counter = nextDescriptor()::counter + 1;
  *(long *)(lVar1 + 0xf0) = (long)iVar2;
  *(SocketType *)(lVar1 + 0x9c) = type;
  *(NetworkLayerProtocol *)(lVar1 + 0xa0) = protocol;
  return true;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }